

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O2

bool __thiscall GNUmakeTokenPoolPosix::ReturnToken(GNUmakeTokenPoolPosix *this)

{
  ssize_t sVar1;
  int *piVar2;
  char buf;
  
  do {
    sVar1 = write(this->wfd_,&buf,1);
    if ((int)sVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return 0 < (int)sVar1;
}

Assistant:

bool GNUmakeTokenPoolPosix::ReturnToken() {
  const char buf = '+';
  while (1) {
    int ret = write(wfd_, &buf, 1);
    if (ret > 0)
      return true;
    if ((ret != -1) || (errno != EINTR))
      return false;
    // write got interrupted - retry
  }
}